

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolvmin.cpp
# Opt level: O3

double __thiscall
chrono::ChOptimizerGenetic::Get_fitness_interval
          (ChOptimizerGenetic *this,ChGenotype **my_population)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ChGenotype *mselected;
  ChGenotype *pCVar3;
  long lVar4;
  int i;
  long lVar5;
  ChGenotype *pCVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double mworstfitness;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  pCVar3 = *my_population;
  lVar4 = (long)*(int *)&(this->super_ChOptimizer).field_0x144;
  dVar10 = pCVar3->fitness;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar10;
  dVar13 = dVar10;
  if (0 < lVar4) {
    auVar12._8_8_ = 0x7fffffffffffffff;
    auVar12._0_8_ = 0x7fffffffffffffff;
    lVar5 = 0;
    pCVar6 = pCVar3;
    auVar9 = auVar11;
    do {
      dVar10 = my_population[lVar5]->fitness;
      auVar14._8_8_ = 0;
      auVar14._0_8_ = dVar10;
      auVar8 = vandpd_avx(auVar14,auVar12);
      uVar1 = vcmppd_avx512vl(auVar8,ZEXT816(0x412e847e00000000),4);
      uVar2 = vcmppd_avx512vl(auVar9,auVar14,1);
      bVar7 = (bool)((byte)uVar1 & 3 & (byte)uVar2 & 1);
      if (bVar7 != false) {
        pCVar6 = my_population[lVar5];
      }
      lVar5 = lVar5 + 1;
      auVar8._0_8_ = (ulong)bVar7 * (long)dVar10 + (ulong)!bVar7 * auVar9._0_8_;
      auVar8._8_8_ = auVar9._8_8_;
      auVar9 = auVar8;
    } while (lVar4 != lVar5);
    lVar5 = 0;
    do {
      dVar10 = my_population[lVar5]->fitness;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = dVar10;
      auVar9 = vandpd_avx(auVar15,auVar12);
      uVar1 = vcmppd_avx512vl(auVar9,ZEXT816(0x412e847e00000000),4);
      uVar2 = vcmppd_avx512vl(auVar15,auVar11,1);
      bVar7 = (bool)((byte)uVar1 & 3 & (byte)uVar2 & 1);
      if (bVar7 != false) {
        pCVar3 = my_population[lVar5];
      }
      lVar5 = lVar5 + 1;
      auVar9._0_8_ = (ulong)bVar7 * (long)dVar10 + (ulong)!bVar7 * auVar11._0_8_;
      auVar9._8_8_ = auVar11._8_8_;
      auVar11 = auVar9;
    } while (lVar4 != lVar5);
    dVar10 = pCVar3->fitness;
    dVar13 = pCVar6->fitness;
  }
  return dVar13 - dVar10;
}

Assistant:

ChGenotype* ChOptimizerGenetic::Select_best(ChGenotype** my_population) {
    ChGenotype* mselected = my_population[0];
    double mbestfitness = my_population[0]->fitness;

    for (int i = 0; i < popsize; i++) {
        if (fabs(my_population[i]->fitness) != OPT_IMPOSSIBLE)
            if (my_population[i]->fitness > mbestfitness) {
                mselected = my_population[i];
                mbestfitness = my_population[i]->fitness;
            }
    }
    // default .
    return mselected;
}